

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

bool __thiscall
Commands::command_handler_register::Handle
          (command_handler_register *this,string *command,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,Command_Source *from,int alias_depth)

{
  _Rb_tree_header *p_Var1;
  Command_Source *pCVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  const_iterator cVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar9;
  undefined4 extraout_var_02;
  _Base_ptr p_Var10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__args;
  string *this_00;
  allocator<char> local_149;
  Command_Source *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  string prefix;
  _Base_ptr local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (command->_M_string_length == 0) {
    iVar5 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&prefix,"unknown_command",(allocator<char> *)&local_110);
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var,iVar5) + 0x490),&prefix);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    this_00 = &local_70;
  }
  else {
    if (100 < alias_depth) {
      Console::Wrn("Command alias nested too deeply or infinitely recursive: %s",
                   (command->_M_dataplus)._M_p);
      return false;
    }
    local_140 = arguments;
    local_118 = (_Base_ptr)
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                        *)this,command);
    p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)local_118 == p_Var1) ||
       ((ulong)((long)(local_140->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_140->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)local_118[3]._M_parent - *(long *)(local_118 + 3)))) {
      cVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->aliases)._M_h,command);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   ((long)cVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        bVar3 = Handle(this,&local_50,local_140,from,alias_depth + 1);
        std::__cxx11::string::~string((string *)&local_50);
        return bVar3;
      }
      p_Var10 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_148 = from;
      local_118 = &p_Var1->_M_header;
      while( true ) {
        pCVar2 = local_148;
        if ((_Rb_tree_header *)p_Var10 == p_Var1) break;
        if ((p_Var10[4]._M_left <= (_Base_ptr)command->_M_string_length) &&
           ((_Base_ptr)command->_M_string_length < p_Var10[2]._M_parent)) {
          std::__cxx11::string::substr((ulong)&prefix,(ulong)(p_Var10 + 2));
          std::__cxx11::string::substr((ulong)&local_110,(ulong)command);
          _Var4 = std::operator==(&local_110,&prefix);
          std::__cxx11::string::~string((string *)&local_110);
          pCVar2 = local_148;
          if (_Var4) {
            iVar5 = (*local_148->_vptr_Command_Source[4])(local_148);
            iVar9 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(CONCAT44(extraout_var_01,iVar5) + 0x1f0),(key_type *)(p_Var10 + 2));
            (*pCVar2->_vptr_Command_Source[4])(pCVar2);
            uVar6 = 4;
            if (iVar9.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                ._M_cur != (__node_type *)0x0) {
              uVar6 = util::variant::GetInt
                                ((variant *)
                                 ((long)iVar9.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                        ._M_cur + 0x28));
              uVar6 = uVar6 & 0xff;
            }
            uVar7 = (*pCVar2->_vptr_Command_Source[*(byte *)((long)&p_Var10[4]._M_right + 1)])
                              (pCVar2);
            if ((uVar6 <= (uVar7 & 0xff)) &&
               (((*(char *)&p_Var10[4]._M_right != '\x01' ||
                 (iVar5 = (*local_148->_vptr_Command_Source[3])(),
                 CONCAT44(extraout_var_02,iVar5) != 0)) &&
                (pCVar2 = local_148, bVar3 = (_Rb_tree_header *)local_118 != p_Var1,
                local_118 = p_Var10, bVar3)))) {
              iVar5 = (*local_148->_vptr_Command_Source[4])(local_148);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"unknown_command",&local_149);
              I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_07,iVar5) + 0x490),&local_110)
              ;
              (*pCVar2->_vptr_Command_Source[5])(pCVar2,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              this_00 = &local_110;
              goto LAB_0011e426;
            }
          }
          std::__cxx11::string::~string((string *)&prefix);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      }
      if ((_Rb_tree_header *)local_118 == p_Var1) {
        iVar5 = (*local_148->_vptr_Command_Source[4])(local_148);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prefix,"unknown_command",(allocator<char> *)&local_110);
        I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_06,iVar5) + 0x490),&prefix);
        (*pCVar2->_vptr_Command_Source[5])(pCVar2,&local_f0);
        this_00 = &local_f0;
      }
      else {
        from = local_148;
        __args = local_140;
        if ((ulong)((long)local_118[3]._M_parent - *(long *)(local_118 + 3)) <=
            (ulong)((long)(local_140->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_140->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)) goto LAB_0011e7c8;
        iVar5 = (*local_148->_vptr_Command_Source[4])(local_148);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&prefix,"command_not_enough_arguments",(allocator<char> *)&local_110);
        I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_03,iVar5) + 0x490),&prefix);
        (*pCVar2->_vptr_Command_Source[5])(pCVar2,&local_d0);
        this_00 = &local_d0;
      }
    }
    else {
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      iVar9 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(CONCAT44(extraout_var_00,iVar5) + 0x1f0),command);
      (*from->_vptr_Command_Source[4])(from);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar6 = 4;
      }
      else {
        uVar6 = util::variant::GetInt
                          ((variant *)
                           ((long)iVar9.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                  ._M_cur + 0x28));
        uVar6 = uVar6 & 0xff;
      }
      __args = local_140;
      uVar7 = (*from->_vptr_Command_Source[*(byte *)((long)&local_118[4]._M_right + 1)])(from);
      if ((uVar6 <= (uVar7 & 0xff)) &&
         ((*(char *)&local_118[4]._M_right != '\x01' ||
          (iVar5 = (*from->_vptr_Command_Source[3])(from), CONCAT44(extraout_var_05,iVar5) != 0))))
      {
LAB_0011e7c8:
        std::
        function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
        ::operator()((function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
                      *)(local_118 + 5),__args,from);
        return true;
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prefix,"unknown_command",(allocator<char> *)&local_110);
      I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_04,iVar5) + 0x490),&prefix);
      (*from->_vptr_Command_Source[5])(from,&local_90);
      this_00 = &local_90;
    }
  }
LAB_0011e426:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&prefix);
  return false;
}

Assistant:

bool command_handler_register::Handle(std::string command, const std::vector<std::string>& arguments, Command_Source* from, int alias_depth) const
{
	if (command.empty())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return false;
	}

	if (alias_depth > 100)
	{
		Console::Wrn("Command alias nested too deeply or infinitely recursive: %s", command.c_str());
		return false;
	}

	auto command_result = handlers.find(command);

	if (command_result != handlers.end() && command_result->second.info.arguments.size() <= arguments.size())
	{
		AdminLevel admin_req = ADMIN_HGM;
		auto admin_result = from->SourceWorld()->admin_config.find(command);

		if (admin_result != from->SourceWorld()->admin_config.end())
			admin_req = AdminLevel(int(admin_result->second));

		int access = command_result->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

		if (access < admin_req || (command_result->second.info.require_character && !from->SourceCharacter()))
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
			return false;
		}

		command_result->second.f(arguments, from);
		return true;
	}
	else
	{
		auto alias_result = aliases.find(command);

		if (alias_result != aliases.end())
		{
			return this->Handle(alias_result->second, arguments, from, alias_depth + 1);
		}

		auto match = handlers.end();

		UTIL_CIFOREACH(handlers, handler)
		{
			if (command.length() < handler->second.info.partial_min_chars
			 || command.length() >= handler->second.info.name.length())
				continue;

			std::string prefix = handler->second.info.name.substr(0, std::max(command.length(), handler->second.info.partial_min_chars));

			if (command.substr(0, prefix.length()) == prefix)
			{
				AdminLevel admin_req = ADMIN_HGM;
				auto admin_result = from->SourceWorld()->admin_config.find(handler->second.info.name);

				if (admin_result != from->SourceWorld()->admin_config.end())
					admin_req = AdminLevel(int(admin_result->second));

				int access = handler->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

				if (access < admin_req || (handler->second.info.require_character && !from->SourceCharacter()))
					continue;

				// Ambiguous abbreviation
				if (match != handlers.end())
				{
					from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
					return false;
				}

				match = handler;
			}
		}

		if (match != handlers.end())
		{
			if (match->second.info.arguments.size() > arguments.size())
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_not_enough_arguments"));
				return false;
			}

			match->second.f(arguments, from);
			return true;
		}
	}

	from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
	return false;
}